

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.h
# Opt level: O0

void __thiscall LTFlightData::FDKeyTy::FDKeyTy(FDKeyTy *this,FDKeyType _eType,unsigned_long _num)

{
  undefined4 *in_RDI;
  unsigned_long in_stack_00000028;
  FDKeyType in_stack_00000034;
  FDKeyTy *in_stack_00000038;
  string local_38 [56];
  
  *in_RDI = 0;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  *(undefined8 *)(in_RDI + 10) = 0;
  SetKey_abi_cxx11_(in_stack_00000038,in_stack_00000034,in_stack_00000028);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

FDKeyTy(FDKeyType _eType, unsigned long _num)                   { SetKey(_eType,_num); }